

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eckey_impl.h
# Opt level: O1

int secp256k1_eckey_pubkey_parse(secp256k1_ge *elem,uchar *pub,size_t size)

{
  bool bVar1;
  int iVar2;
  secp256k1_pubkey *pubkey;
  ulong *extraout_RDX;
  secp256k1_ge *a;
  secp256k1_fe *x_00;
  secp256k1_context *ctx;
  uint in_R8D;
  secp256k1_fe x;
  secp256k1_fe y;
  ulong uStack_140;
  secp256k1_fe *psStack_138;
  secp256k1_ge sStack_130;
  secp256k1_ge *psStack_c8;
  secp256k1_context *psStack_c0;
  undefined8 uStack_b8;
  uchar *puStack_b0;
  ulong uStack_a8;
  code *pcStack_a0;
  secp256k1_ge *local_98;
  secp256k1_fe local_90;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  uint64_t local_40;
  int local_38;
  int iStack_34;
  
  if (size != 0x41) {
    if (size != 0x21) {
      return 0;
    }
    if ((*pub & 0xfe) != 2) {
      return 0;
    }
    pcStack_a0 = (code *)0x1188c8;
    secp256k1_fe_impl_set_b32_mod(&local_90,pub + 1);
    if (local_90.n[0] < 0xffffefffffc2f ||
        ((local_90.n[2] & local_90.n[3] & local_90.n[1]) != 0xfffffffffffff ||
        local_90.n[4] != 0xffffffffffff)) {
      local_90.magnitude = 1;
      local_90.normalized = 1;
      pcStack_a0 = (code *)0x118a24;
      secp256k1_fe_verify(&local_90);
      pcStack_a0 = (code *)0x118a45;
      iVar2 = secp256k1_ge_set_xo_var(elem,&local_90,(uint)(*pub == '\x03'));
      return iVar2;
    }
    return 0;
  }
  if (7 < *pub) {
    return 0;
  }
  if ((0xd0U >> (*pub & 0x1f) & 1) == 0) {
    return 0;
  }
  pcStack_a0 = (code *)0x118974;
  local_98 = elem;
  secp256k1_fe_impl_set_b32_mod(&local_90,pub + 1);
  pubkey = (secp256k1_pubkey *)
           (local_90.n[2] & local_90.n[3] & local_90.n[1] ^ 0xfffffffffffff |
           local_90.n[4] ^ 0xffffffffffff);
  if (0xffffefffffc2e < local_90.n[0] && pubkey == (secp256k1_pubkey *)0x0) {
    return 0;
  }
  local_90.magnitude = 1;
  local_90.normalized = 1;
  pcStack_a0 = (code *)0x1189be;
  secp256k1_fe_verify(&local_90);
  pcStack_a0 = (code *)0x1189da;
  secp256k1_fe_impl_set_b32_mod((secp256k1_fe *)&stack0xffffffffffffffa0,pub + 0x21);
  bVar1 = (local_50 & local_48 & local_58) == 0xfffffffffffff;
  if (0xffffefffffc2e < local_60 && (bVar1 && local_40 == 0xffffffffffff)) {
    local_38 = -1;
  }
  else {
    local_38 = 1;
    iStack_34 = 1;
    pcStack_a0 = (code *)0x118a5f;
    secp256k1_fe_verify((secp256k1_fe *)&stack0xffffffffffffffa0);
  }
  a = local_98;
  if (0xffffefffffc2e < local_60 && (bVar1 && local_40 == 0xffffffffffff)) {
    return 0;
  }
  x_00 = &local_90;
  pcStack_a0 = (code *)0x118a7a;
  secp256k1_ge_set_xy(local_98,x_00,(secp256k1_fe *)&stack0xffffffffffffffa0);
  if ((*pub & 0xfe) == 6) {
    pcStack_a0 = (code *)0x118a90;
    ctx = (secp256k1_context *)&stack0xffffffffffffffa0;
    secp256k1_fe_verify((secp256k1_fe *)&stack0xffffffffffffffa0);
    if (iStack_34 == 0) {
      pcStack_a0 = secp256k1_ec_pubkey_serialize;
      secp256k1_eckey_pubkey_parse_cold_1();
      pcStack_a0 = (code *)0x0;
      uStack_a8 = local_60;
      uStack_b8 = 0xffffefffffc2e;
      psStack_c8 = a;
      psStack_c0 = (secp256k1_context *)&stack0xffffffffffffffa0;
      puStack_b0 = pub;
      if (ctx == (secp256k1_context *)0x0) {
        secp256k1_ec_pubkey_serialize_cold_6();
      }
      else if (extraout_RDX != (ulong *)0x0) {
        uStack_140 = *extraout_RDX;
        if (uStack_140 < (ulong)((in_R8D & 0x100) == 0) * 0x20 + 0x21) {
          secp256k1_ec_pubkey_serialize_cold_4();
          return 0;
        }
        *extraout_RDX = 0;
        if (x_00 == (secp256k1_fe *)0x0) {
          secp256k1_ec_pubkey_serialize_cold_3();
          return 0;
        }
        psStack_138 = x_00;
        memset(x_00,0,uStack_140);
        if (pubkey == (secp256k1_pubkey *)0x0) {
          secp256k1_ec_pubkey_serialize_cold_2();
          return 0;
        }
        if ((char)in_R8D != '\x02') {
          secp256k1_ec_pubkey_serialize_cold_1();
          return 0;
        }
        iVar2 = secp256k1_pubkey_load(ctx,&sStack_130,pubkey);
        if (iVar2 == 0) {
          return 0;
        }
        iVar2 = secp256k1_eckey_pubkey_serialize
                          (&sStack_130,(uchar *)psStack_138,&uStack_140,in_R8D & 0x100);
        if (iVar2 == 0) {
          return 0;
        }
        *extraout_RDX = uStack_140;
        return 1;
      }
      secp256k1_ec_pubkey_serialize_cold_5();
      return 0;
    }
    a = local_98;
    if ((*pub != '\a') == (bool)((byte)local_60 & 1)) {
      return 0;
    }
  }
  pcStack_a0 = (code *)0x118ab4;
  iVar2 = secp256k1_ge_is_valid_var(a);
  return iVar2;
}

Assistant:

static int secp256k1_eckey_pubkey_parse(secp256k1_ge *elem, const unsigned char *pub, size_t size) {
    if (size == 33 && (pub[0] == SECP256K1_TAG_PUBKEY_EVEN || pub[0] == SECP256K1_TAG_PUBKEY_ODD)) {
        secp256k1_fe x;
        return secp256k1_fe_set_b32_limit(&x, pub+1) && secp256k1_ge_set_xo_var(elem, &x, pub[0] == SECP256K1_TAG_PUBKEY_ODD);
    } else if (size == 65 && (pub[0] == SECP256K1_TAG_PUBKEY_UNCOMPRESSED || pub[0] == SECP256K1_TAG_PUBKEY_HYBRID_EVEN || pub[0] == SECP256K1_TAG_PUBKEY_HYBRID_ODD)) {
        secp256k1_fe x, y;
        if (!secp256k1_fe_set_b32_limit(&x, pub+1) || !secp256k1_fe_set_b32_limit(&y, pub+33)) {
            return 0;
        }
        secp256k1_ge_set_xy(elem, &x, &y);
        if ((pub[0] == SECP256K1_TAG_PUBKEY_HYBRID_EVEN || pub[0] == SECP256K1_TAG_PUBKEY_HYBRID_ODD) &&
            secp256k1_fe_is_odd(&y) != (pub[0] == SECP256K1_TAG_PUBKEY_HYBRID_ODD)) {
            return 0;
        }
        return secp256k1_ge_is_valid_var(elem);
    } else {
        return 0;
    }
}